

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O3

void __thiscall
llvm::
DenseMapBase<llvm::DenseMap<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
::initEmpty(DenseMapBase<llvm::DenseMap<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            *this)

{
  uint uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined8 *puVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  
  *(undefined8 *)(this + 8) = 0;
  auVar3 = _DAT_0019d1f0;
  auVar2 = _DAT_0019d1e0;
  uVar1 = *(uint *)(this + 0x10);
  if ((uVar1 & uVar1 - 1) == 0) {
    if ((ulong)uVar1 != 0) {
      uVar5 = (ulong)uVar1 + 0x7ffffffffffffff;
      uVar6 = uVar5 & 0x7ffffffffffffff;
      auVar8._8_4_ = (int)uVar6;
      auVar8._0_8_ = uVar6;
      auVar8._12_4_ = (int)(uVar6 >> 0x20);
      puVar4 = (undefined8 *)(*(long *)this + 0x20);
      lVar7 = 0;
      auVar8 = auVar8 ^ _DAT_0019d1f0;
      do {
        auVar9._8_4_ = (int)lVar7;
        auVar9._0_8_ = lVar7;
        auVar9._12_4_ = (int)((ulong)lVar7 >> 0x20);
        auVar9 = (auVar9 | auVar2) ^ auVar3;
        if ((bool)(~(auVar9._4_4_ == auVar8._4_4_ && auVar8._0_4_ < auVar9._0_4_ ||
                    auVar8._4_4_ < auVar9._4_4_) & 1)) {
          puVar4[-4] = 0xffffffffffffffff;
        }
        if ((auVar9._12_4_ != auVar8._12_4_ || auVar9._8_4_ <= auVar8._8_4_) &&
            auVar9._12_4_ <= auVar8._12_4_) {
          *puVar4 = 0xffffffffffffffff;
        }
        lVar7 = lVar7 + 2;
        puVar4 = puVar4 + 8;
      } while ((uVar6 - ((uint)uVar5 & 1)) + 2 != lVar7);
    }
    return;
  }
  __assert_fail("(getNumBuckets() & (getNumBuckets()-1)) == 0 && \"# initial buckets must be a power of two!\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/DenseMap.h"
                ,0x158,
                "void llvm::DenseMapBase<llvm::DenseMap<unsigned long, std::vector<unsigned char>>, unsigned long, std::vector<unsigned char>, llvm::DenseMapInfo<unsigned long>, llvm::detail::DenseMapPair<unsigned long, std::vector<unsigned char>>>::initEmpty() [DerivedT = llvm::DenseMap<unsigned long, std::vector<unsigned char>>, KeyT = unsigned long, ValueT = std::vector<unsigned char>, KeyInfoT = llvm::DenseMapInfo<unsigned long>, BucketT = llvm::detail::DenseMapPair<unsigned long, std::vector<unsigned char>>]"
               );
}

Assistant:

void initEmpty() {
    setNumEntries(0);
    setNumTombstones(0);

    assert((getNumBuckets() & (getNumBuckets()-1)) == 0 &&
           "# initial buckets must be a power of two!");
    const KeyT EmptyKey = getEmptyKey();
    for (BucketT *B = getBuckets(), *E = getBucketsEnd(); B != E; ++B)
      ::new (&B->getFirst()) KeyT(EmptyKey);
  }